

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::draw_image
          (CImg<unsigned_int> *this,int x0,int y0,int z0,int c0,CImg<unsigned_int> *sprite,
          float opacity)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  CImg<unsigned_int> *pCVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar32;
  float fVar33;
  long local_168;
  long local_150;
  CImg<unsigned_int> local_68;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  puVar3 = this->_data;
  if (puVar3 != (uint *)0x0) {
    uVar6 = this->_width;
    if (uVar6 != 0) {
      uVar12 = this->_height;
      if (uVar12 != 0) {
        uVar13 = this->_depth;
        if (((uVar13 != 0) && (this->_spectrum != 0)) &&
           (puVar4 = sprite->_data, puVar4 != (uint *)0x0)) {
          uVar23 = this->_spectrum;
          uVar14 = sprite->_width;
          uVar20 = sprite->_height;
          uVar8 = sprite->_depth;
          uVar7 = sprite->_spectrum;
          if ((puVar4 < puVar3 + (ulong)uVar13 * (ulong)uVar23 * (ulong)uVar12 * (ulong)uVar6) &&
             (puVar3 < puVar4 + (ulong)uVar8 * (ulong)uVar7 * (ulong)uVar20 * (ulong)uVar14)) {
            CImg(&local_68,sprite,false);
            this = draw_image(this,x0,y0,z0,c0,&local_68,opacity);
            if ((local_68._is_shared == false) && (local_68._data != (uint *)0x0)) {
              operator_delete__(local_68._data);
            }
          }
          else {
            if ((((((y0 == 0 && x0 == 0) && z0 == 0) && c0 == 0) &&
                 ((1.0 <= opacity && (uVar6 == uVar14)))) && (uVar12 == uVar20)) &&
               (((uVar13 == uVar8 && (uVar23 == uVar7)) && (this->_is_shared == false)))) {
              pCVar9 = assign<unsigned_int>(this,sprite,false);
              return pCVar9;
            }
            uVar25 = 0;
            if (0 < x0) {
              uVar25 = x0;
            }
            uVar28 = 0;
            if (0 < y0) {
              uVar28 = y0;
            }
            uVar10 = 0;
            if (0 < z0) {
              uVar10 = z0;
            }
            uVar11 = 0;
            if (0 < c0) {
              uVar11 = c0;
            }
            uVar26 = uVar25 - x0;
            iVar29 = uVar6 - (uVar14 + x0);
            if ((int)(uVar14 + x0) <= (int)uVar6) {
              iVar29 = 0;
            }
            iVar29 = iVar29 + (uVar14 - uVar26);
            iVar5 = uVar12 - (uVar20 + y0);
            if ((int)(uVar20 + y0) <= (int)uVar12) {
              iVar5 = 0;
            }
            iVar22 = uVar13 - (uVar8 + z0);
            if ((int)(uVar8 + z0) <= (int)uVar13) {
              iVar22 = 0;
            }
            iVar19 = uVar23 - (uVar7 + c0);
            if ((int)(uVar7 + c0) <= (int)uVar23) {
              iVar19 = 0;
            }
            if (0 < iVar29) {
              uVar12 = uVar28 - y0;
              uVar6 = iVar5 + (uVar20 - uVar12);
              if (0 < (int)uVar6) {
                uVar13 = uVar10 - z0;
                uVar23 = iVar22 + (uVar8 - uVar13);
                if (0 < (int)uVar23) {
                  uVar14 = uVar11 - c0;
                  uVar20 = iVar19 + (uVar7 - uVar14);
                  if (0 < (int)uVar20) {
                    fVar33 = ABS(opacity);
                    uStack_44 = in_XMM0_Db & 0x7fffffff;
                    uStack_40 = in_XMM0_Dc & 0x7fffffff;
                    uStack_3c = in_XMM0_Dd & 0x7fffffff;
                    fVar32 = 0.0;
                    if (0.0 <= opacity) {
                      fVar32 = opacity;
                    }
                    local_150 = (ulong)uVar11 * 4;
                    uVar18 = 0;
                    uVar8 = uVar14;
                    local_48 = fVar33;
                    do {
                      uVar15 = 0;
                      local_168 = (ulong)uVar10 * 4;
                      uVar7 = uVar13;
                      do {
                        uVar30 = 0;
                        lVar31 = (ulong)uVar28 * 4;
                        uVar21 = uVar12;
                        do {
                          uVar24 = (ulong)this->_width;
                          uVar27 = (ulong)sprite->_width;
                          uVar1 = sprite->_height;
                          uVar2 = sprite->_depth;
                          puVar3 = this->_data;
                          puVar4 = sprite->_data;
                          if (1.0 <= opacity) {
                            lVar17 = this->_height * uVar24;
                            lVar16 = uVar1 * uVar27;
                            memcpy(puVar3 + (ulong)uVar25 +
                                            (uVar28 + uVar30) * uVar24 +
                                            lVar17 * (uVar10 + uVar15) +
                                            (ulong)this->_depth * (uVar11 + uVar18) * lVar17,
                                   puVar4 + (ulong)uVar26 +
                                            (uVar12 + (int)uVar30) * uVar27 +
                                            lVar16 * (ulong)(uVar13 + (int)uVar15) +
                                            (ulong)uVar2 * (ulong)(uVar14 + (int)uVar18) * lVar16,
                                   (long)iVar29 << 2);
                            fVar33 = local_48;
                          }
                          else {
                            lVar17 = (((ulong)this->_depth * local_150 + local_168) *
                                      (ulong)this->_height + lVar31) * uVar24 + (ulong)uVar25 * 4;
                            lVar16 = 0;
                            do {
                              *(int *)((long)puVar3 + lVar16 * 4 + lVar17) =
                                   (int)(long)((float)*(uint *)((long)puVar4 +
                                                               lVar16 * 4 +
                                                               (((ulong)uVar2 * (ulong)uVar8 * 4 +
                                                                (ulong)uVar7 * 4) * (ulong)uVar1 +
                                                               (ulong)uVar21 * 4) * uVar27 +
                                                               (ulong)uVar26 * 4) * fVar33 +
                                              (float)*(uint *)((long)puVar3 + lVar16 * 4 + lVar17) *
                                              (1.0 - fVar32));
                              lVar16 = lVar16 + 1;
                            } while ((int)lVar16 < iVar29);
                          }
                          uVar30 = uVar30 + 1;
                          uVar21 = uVar21 + 1;
                          lVar31 = lVar31 + 4;
                        } while (uVar30 < uVar6);
                        uVar15 = uVar15 + 1;
                        uVar7 = uVar7 + 1;
                        local_168 = local_168 + 4;
                      } while (uVar15 < uVar23);
                      uVar18 = uVar18 + 1;
                      uVar8 = uVar8 + 1;
                      local_150 = local_150 + 4;
                    } while (uVar18 < uVar20);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<T>& sprite, const float opacity=1) {
      if (is_empty() || !sprite) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,opacity);
      if (x0==0 && y0==0 && z0==0 && c0==0 && is_sameXYZC(sprite) && opacity>=1 && !is_shared())
        return assign(sprite,false);
      const bool bx = x0<0, by = y0<0, bz = z0<0, bc = c0<0;
      const int
        dx0 = bx?0:x0, dy0 = by?0:y0, dz0 = bz?0:z0, dc0 = bc?0:c0,
        sx0 = dx0 - x0,  sy0 = dy0 - y0, sz0 = dz0 - z0, sc0 = dc0 - c0,
        lx = sprite.width() - sx0 - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0),
        ly = sprite.height() - sy0 - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0),
        lz = sprite.depth() - sz0 - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0),
        lc = sprite.spectrum() - sc0 - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0);
      const ulongT slx = lx*sizeof(T);

      const float nopacity = cimg::abs(opacity), copacity = 1 - std::max(opacity,0.f);
      if (lx>0 && ly>0 && lz>0 && lc>0) {
        for (int c = 0; c<lc; ++c)
          for (int z = 0; z<lz; ++z)
            for (int y = 0; y<ly; ++y) {
              T *ptrd = data(dx0,dy0 + y,dz0 + z,dc0 + c);
              const T *ptrs = sprite.data(sx0,sy0 + y,sz0 + z,sc0 + c);
              if (opacity>=1) std::memcpy(ptrd,ptrs,slx);
              else for (int x = 0; x<lx; ++x) { *ptrd = (T)(nopacity*(*(ptrs++)) + *ptrd*copacity); ++ptrd; }
            }
      }
      return *this;
    }